

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Var *out_type)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  Enum EVar3;
  char *format;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  Location local_268;
  Var local_248;
  string local_200;
  Type local_1e0;
  bool local_1b9;
  Type TStack_1b8;
  bool is_enabled;
  Type type;
  Token token;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_159;
  allocator<char> local_158;
  allocator<char> local_157;
  allocator<char> local_156;
  allocator<char> local_155;
  allocator<char> local_154;
  allocator<char> local_153;
  allocator<char> local_152;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string asStack_130 [32];
  string asStack_110 [32];
  string asStack_f0 [32];
  string asStack_d0 [32];
  string asStack_b0 [32];
  string asStack_90 [32];
  string asStack_70 [32];
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  undefined1 local_22;
  byte local_21;
  bool is_value_type;
  Var *pVStack_20;
  bool is_ref_type;
  Var *out_type_local;
  WastParser *this_local;
  
  pVStack_20 = out_type;
  out_type_local = (Var *)this;
  local_21 = PeekMatchRefType(this);
  local_22 = PeekMatch(this,First_Type,0);
  if (((bool)local_22) || ((local_21 & 1) != 0)) {
    if ((local_21 & 1) == 0) {
      Consume((Token *)&type,this);
      TStack_1b8 = Token::type((Token *)&type);
      EVar3 = Type::operator_cast_to_Enum(&stack0xfffffffffffffe48);
      if (EVar3 == ExnRef) {
        local_1b9 = Features::exceptions_enabled((Features *)this->options_);
      }
      else if ((uint)(EVar3 + 0x11) < 2) {
        local_1b9 = Features::reference_types_enabled((Features *)this->options_);
      }
      else if (EVar3 == V128) {
        local_1b9 = Features::simd_enabled((Features *)this->options_);
      }
      else {
        local_1b9 = true;
      }
      if (local_1b9 == false) {
        local_1e0 = type;
        Type::GetName_abi_cxx11_(&local_200,&stack0xfffffffffffffe48);
        format = (char *)std::__cxx11::string::c_str();
        Error(this,0x37771c,format);
        std::__cxx11::string::~string((string *)&local_200);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        EVar3 = Type::operator_cast_to_Enum(&stack0xfffffffffffffe48);
        GetLocation(&local_268,this);
        Var::Var(&local_248,EVar3,&local_268);
        Var::operator=(pVStack_20,&local_248);
        Var::~Var(&local_248);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
    else {
      RVar2 = Expect(this,Lpar);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        RVar2 = Expect(this,Ref);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
        else {
          RVar2 = ParseVar(this,pVStack_20);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
          }
          else {
            RVar2 = Expect(this,Rpar);
            bVar1 = Failed(RVar2);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
            }
            else {
              Result::Result((Result *)((long)&this_local + 4),Ok);
            }
          }
        }
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"i32",&local_151);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_130,"i64",&local_152);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_110,"f32",&local_153);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_f0,"f64",&local_154);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_d0,"v128",&local_155);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_b0,"externref",&local_156);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_90,"exnref",&local_157);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(asStack_70,"funcref",&local_158);
    local_50 = &local_150;
    local_48 = 8;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_159);
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_40,__l,&local_159);
    this_local._4_4_ = ErrorExpected(this,&local_40,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_159);
    local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
    do {
      local_278 = local_278 + -1;
      std::__cxx11::string::~string((string *)local_278);
    } while (local_278 != &local_150);
    std::allocator<char>::~allocator(&local_158);
    std::allocator<char>::~allocator(&local_157);
    std::allocator<char>::~allocator(&local_156);
    std::allocator<char>::~allocator(&local_155);
    std::allocator<char>::~allocator(&local_154);
    std::allocator<char>::~allocator(&local_153);
    std::allocator<char>::~allocator(&local_152);
    std::allocator<char>::~allocator(&local_151);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseValueType(Var* out_type) {
  WABT_TRACE(ParseValueType);

  const bool is_ref_type = PeekMatchRefType();
  const bool is_value_type = PeekMatch(TokenType::ValueType);

  if (!is_value_type && !is_ref_type) {
    return ErrorExpected(
        {"i32", "i64", "f32", "f64", "v128", "externref", "exnref", "funcref"});
  }

  if (is_ref_type) {
    EXPECT(Lpar);
    EXPECT(Ref);
    CHECK_RESULT(ParseVar(out_type));
    EXPECT(Rpar);
    return Result::Ok;
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::FuncRef:
    case Type::ExternRef:
      is_enabled = options_->features.reference_types_enabled();
      break;
    case Type::ExnRef:
      is_enabled = options_->features.exceptions_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = Var(type, GetLocation());
  return Result::Ok;
}